

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.cc
# Opt level: O0

Surface * __thiscall SDL2pp::Surface::SetColorKey(Surface *this,bool flag,Uint32 key)

{
  int iVar1;
  Exception *this_00;
  Uint32 key_local;
  bool flag_local;
  Surface *this_local;
  
  iVar1 = SDL_SetColorKey(this->surface_,flag,key);
  if (iVar1 != 0) {
    this_00 = (Exception *)__cxa_allocate_exception(0x50);
    Exception::Exception(this_00,"SDL_SetColorKey");
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  return this;
}

Assistant:

Surface& Surface::SetColorKey(bool flag, Uint32 key) {
	if (SDL_SetColorKey(surface_, flag, key) != 0)
		throw Exception("SDL_SetColorKey");
	return *this;
}